

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall ClipperLib::Clipper::FixupOutPolygon(Clipper *this,OutRec *outRec)

{
  OutPt *pOVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  OutPt *pOVar5;
  OutPt *pOVar6;
  OutPt *pOVar7;
  OutPt **ppOVar8;
  OutPt *tmp;
  OutPt *pp;
  IntPoint pt3;
  IntPoint pt2;
  OutPt *local_38;
  
  local_38 = outRec->bottomPt;
  outRec->pts = local_38;
  pOVar5 = local_38->prev;
  pOVar6 = local_38;
  if (pOVar5 != local_38) {
    pOVar7 = (OutPt *)0x0;
    pp = local_38;
    do {
      ppOVar8 = &pp->prev;
      pOVar1 = pp->next;
      pOVar6 = pp;
      if (pOVar5 == pOVar1) break;
      lVar2 = (pp->pt).X;
      lVar3 = (pOVar1->pt).X;
      if (((lVar2 == lVar3) && ((pp->pt).Y == (pOVar1->pt).Y)) ||
         (pt3.Y = (pOVar1->pt).Y, pt3.X = lVar3, pt2.Y = (pp->pt).Y, pt2.X = lVar2,
         bVar4 = SlopesEqual(pOVar5->pt,pt2,pt3,
                             (bool)(this->_vptr_Clipper[-3] + 0x10)
                                   [(long)&(this->m_PolyOuts).
                                           super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                   ]), bVar4)) {
        if (pp == outRec->bottomPt) {
          outRec->bottomPt = (OutPt *)0x0;
        }
        (*ppOVar8)->next = pp->next;
        pp->next->prev = *ppOVar8;
        pOVar6 = *ppOVar8;
        if (pp != (OutPt *)0x0) {
          operator_delete(pp,0x28);
        }
        pOVar7 = (OutPt *)0x0;
      }
      else {
        if (pp == pOVar7) {
          if (outRec->bottomPt != (OutPt *)0x0) {
            return;
          }
          local_38 = pp;
          pOVar5 = GetBottomPt(pp);
          outRec->bottomPt = pOVar5;
          pOVar5->idx = outRec->idx;
          outRec->pts = outRec->bottomPt;
          return;
        }
        if (pOVar7 == (OutPt *)0x0) {
          pOVar7 = pp;
        }
        pOVar6 = pp->next;
      }
      pOVar5 = pOVar6->prev;
      pp = pOVar6;
    } while (pOVar5 != pOVar6);
  }
  local_38 = pOVar6;
  DisposeOutPts(&local_38);
  outRec->pts = (OutPt *)0x0;
  outRec->bottomPt = (OutPt *)0x0;
  return;
}

Assistant:

void Clipper::FixupOutPolygon(OutRec &outRec)
{
  //FixupOutPolygon() - removes duplicate points and simplifies consecutive
  //parallel edges by removing the middle vertex.
  OutPt *lastOK = 0;
  outRec.pts = outRec.bottomPt;
  OutPt *pp = outRec.bottomPt;

  for (;;)
  {
    if (pp->prev == pp || pp->prev == pp->next )
    {
      DisposeOutPts(pp);
      outRec.pts = 0;
      outRec.bottomPt = 0;
      return;
    }
    //test for duplicate points and for same slope (cross-product) ...
    if ( PointsEqual(pp->pt, pp->next->pt) ||
      SlopesEqual(pp->prev->pt, pp->pt, pp->next->pt, m_UseFullRange) )
    {
      lastOK = 0;
      OutPt *tmp = pp;
      if (pp == outRec.bottomPt)
        outRec.bottomPt = 0; //flags need for updating
      pp->prev->next = pp->next;
      pp->next->prev = pp->prev;
      pp = pp->prev;
      delete tmp;
    }
    else if (pp == lastOK) break;
    else
    {
      if (!lastOK) lastOK = pp;
      pp = pp->next;
    }
  }
  if (!outRec.bottomPt) {
    outRec.bottomPt = GetBottomPt(pp);
    outRec.bottomPt->idx = outRec.idx;
    outRec.pts = outRec.bottomPt;
  }
}